

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

void __thiscall CFG::splitUpLongerBodies(CFG *this)

{
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l_00;
  size_type sVar1;
  reference ppPVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__x;
  string *psVar3;
  ulong uVar4;
  Production *pPVar5;
  reference pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_238;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d8;
  __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
  local_198;
  __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
  local_190;
  const_iterator local_188;
  undefined1 local_17a;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_179;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_178;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_170;
  string local_150 [32];
  iterator local_130;
  size_type local_128;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_120;
  Production *local_108;
  Production *production;
  int lastElement;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0 [32];
  iterator local_b0;
  size_type local_a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  Production *local_88;
  Production *production_1;
  string newVariable;
  int j;
  undefined1 local_50 [8];
  string previousVar;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  productionTo;
  int i;
  CFG *this_local;
  
  productionTo.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ = 0;
  while( true ) {
    sVar1 = std::vector<Production_*,_std::allocator<Production_*>_>::size(&this->productionsP);
    if (sVar1 <= (ulong)(long)productionTo.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_) break;
    ppPVar2 = std::vector<Production_*,_std::allocator<Production_*>_>::operator[]
                        (&this->productionsP,
                         (long)productionTo.
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
    __x = Production::getToP_abi_cxx11_(*ppPVar2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)&previousVar.field_2 + 8),__x);
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)((long)&previousVar.field_2 + 8));
    if (2 < sVar1) {
      ppPVar2 = std::vector<Production_*,_std::allocator<Production_*>_>::operator[]
                          (&this->productionsP,
                           (long)productionTo.
                                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      psVar3 = Production::getFromP_abi_cxx11_(*ppPVar2);
      std::__cxx11::string::string((string *)local_50,(string *)psVar3);
      newVariable.field_2._8_4_ = 0;
      while( true ) {
        uVar4 = (ulong)(int)newVariable.field_2._8_4_;
        sVar1 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)((long)&previousVar.field_2 + 8));
        if (sVar1 - 2 <= uVar4) break;
        findNewUnusedVariableLetter_abi_cxx11_((string *)&production_1,this);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&this->nonTerminalsV,(value_type *)&production_1);
        pPVar5 = (Production *)operator_new(0x38);
        production._6_1_ = 1;
        _lastElement = &local_f0;
        pvVar6 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)((long)&previousVar.field_2 + 8),
                              (long)(int)newVariable.field_2._8_4_);
        std::__cxx11::string::string((string *)&local_f0,(string *)pvVar6);
        _lastElement = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_d0
        ;
        std::__cxx11::string::string((string *)_lastElement,(string *)&production_1);
        local_b0 = &local_f0;
        local_a8 = 2;
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                     *)((long)&production + 7));
        __l_00._M_len = local_a8;
        __l_00._M_array = local_b0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::vector(&local_a0,__l_00,
                 (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&production + 7));
        Production::Production(pPVar5,(string *)local_50,&local_a0);
        production._6_1_ = 0;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_a0);
        std::
        allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)((long)&production + 7));
        local_1d8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_b0;
        do {
          local_1d8 = local_1d8 + -1;
          std::__cxx11::string::~string((string *)local_1d8);
        } while (local_1d8 != &local_f0);
        local_88 = pPVar5;
        std::vector<Production*,std::allocator<Production*>>::emplace_back<Production*&>
                  ((vector<Production*,std::allocator<Production*>> *)&this->productionsP,&local_88)
        ;
        std::__cxx11::string::operator=((string *)local_50,(string *)&production_1);
        std::__cxx11::string::~string((string *)&production_1);
        newVariable.field_2._8_4_ = newVariable.field_2._8_4_ + 1;
      }
      sVar1 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&previousVar.field_2 + 8));
      production._0_4_ = (int)sVar1 + -1;
      pPVar5 = (Production *)operator_new(0x38);
      local_17a = 1;
      local_178 = &local_170;
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&previousVar.field_2 + 8),(long)((int)production + -1));
      std::__cxx11::string::string((string *)&local_170,(string *)pvVar6);
      local_178 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_150;
      pvVar6 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             *)((long)&previousVar.field_2 + 8),(long)(int)production);
      std::__cxx11::string::string(local_150,(string *)pvVar6);
      local_130 = &local_170;
      local_128 = 2;
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      allocator(&local_179);
      __l._M_len = local_128;
      __l._M_array = local_130;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::vector(&local_120,__l,&local_179);
      Production::Production(pPVar5,(string *)local_50,&local_120);
      local_17a = 0;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_120);
      std::
      allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
      ~allocator(&local_179);
      local_238 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_130;
      do {
        local_238 = local_238 + -1;
        std::__cxx11::string::~string((string *)local_238);
      } while (local_238 != &local_170);
      local_108 = pPVar5;
      std::vector<Production*,std::allocator<Production*>>::emplace_back<Production*&>
                ((vector<Production*,std::allocator<Production*>> *)&this->productionsP,&local_108);
      local_198._M_current =
           (Production **)
           std::vector<Production_*,_std::allocator<Production_*>_>::begin(&this->productionsP);
      local_190 = __gnu_cxx::
                  __normal_iterator<Production_**,_std::vector<Production_*,_std::allocator<Production_*>_>_>
                  ::operator+(&local_198,
                              (long)productionTo.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
      __gnu_cxx::
      __normal_iterator<Production*const*,std::vector<Production*,std::allocator<Production*>>>::
      __normal_iterator<Production**>
                ((__normal_iterator<Production*const*,std::vector<Production*,std::allocator<Production*>>>
                  *)&local_188,&local_190);
      std::vector<Production_*,_std::allocator<Production_*>_>::erase(&this->productionsP,local_188)
      ;
      productionTo.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
           productionTo.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + -1;
      std::__cxx11::string::~string((string *)local_50);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&previousVar.field_2 + 8));
    productionTo.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ =
         productionTo.
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_ + 1;
  }
  return;
}

Assistant:

void CFG::splitUpLongerBodies() {

    for (int i = 0; i < productionsP.size(); ++i) {

        auto productionTo = productionsP[i]->getToP();

        // Only modify variables longer than 2
        if (productionTo.size() > 2) {

            std::string previousVar = productionsP[i]->getFromP();

            for (int j = 0; j < productionTo.size() - 2; ++j) {
                std::string newVariable = findNewUnusedVariableLetter();
                nonTerminalsV.push_back(newVariable);
                Production *production = new Production(previousVar, {productionTo[j], newVariable});
                productionsP.emplace_back(production);
                previousVar = newVariable;
            }

            int lastElement = productionTo.size() - 1;
            Production *production = new Production(previousVar,
                                                    {productionTo[lastElement - 1], productionTo[lastElement]});
            productionsP.emplace_back(production);

            productionsP.erase(productionsP.begin() + i);
            i--;
        }
    }
}